

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_search.cpp
# Opt level: O1

void __thiscall
ANNkd_tree::annkSearch
          (ANNkd_tree *this,ANNpoint q,int k,ANNidxArray nn_idx,ANNdistArray dd,double eps)

{
  int iVar1;
  double *pdVar2;
  int *piVar3;
  ANNkd_ptr pAVar4;
  long lVar5;
  double *pdVar6;
  int *piVar7;
  ANNmin_k *pAVar8;
  mk_node *pmVar9;
  ulong uVar10;
  ANNidx AVar11;
  ulong uVar12;
  
  ANNkdDim = this->dim;
  lVar5 = (long)ANNkdDim;
  uVar10 = lVar5 * 8;
  if (lVar5 < 0) {
    uVar10 = 0xffffffffffffffff;
  }
  uVar12 = lVar5 * 4;
  if (lVar5 < 0) {
    uVar12 = 0xffffffffffffffff;
  }
  pdVar6 = (double *)operator_new__(uVar10);
  ANNScale = pdVar6;
  piVar7 = (int *)operator_new__(uVar12);
  iVar1 = this->dim;
  ANNTopology = piVar7;
  if (0 < (long)iVar1) {
    pdVar2 = this->Scale;
    piVar3 = this->Topology;
    lVar5 = 0;
    do {
      pdVar6[lVar5] = pdVar2[lVar5];
      piVar7[lVar5] = piVar3[lVar5];
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  ANNkdPts = this->pts;
  ANNptsVisited = 0;
  ANNkdQ = q;
  if (this->n_pts < k) {
    annError("Requesting more near neighbors than data points",ANNabort);
  }
  ANNkdMaxErr = (eps + 1.0) * (eps + 1.0);
  pAVar8 = (ANNmin_k *)operator_new(0x10);
  pAVar8->n = 0;
  pAVar8->k = k;
  uVar10 = 0xffffffffffffffff;
  if (-2 < k) {
    uVar10 = (long)k * 0x10 + 0x10;
  }
  pmVar9 = (mk_node *)operator_new__(uVar10);
  pAVar8->mk = pmVar9;
  pAVar4 = this->root;
  ANNkdPointMK = pAVar8;
  annBoxDistance(q,this->bnd_box_lo,this->bnd_box_hi,this->dim,ANNScale,ANNTopology);
  (*pAVar4->_vptr_ANNkd_node[2])(pAVar4);
  pAVar8 = ANNkdPointMK;
  if (0 < k) {
    lVar5 = 1;
    uVar10 = 0;
    do {
      if ((long)uVar10 < (long)pAVar8->n) {
        pmVar9 = pAVar8->mk;
        dd[uVar10] = *(ANNdist *)((long)pmVar9 + lVar5 * 8 + -8);
        AVar11 = *(ANNidx *)(&pmVar9->key + lVar5);
      }
      else {
        dd[uVar10] = 1.79769313486232e+308;
        AVar11 = -1;
      }
      nn_idx[uVar10] = AVar11;
      uVar10 = uVar10 + 1;
      lVar5 = lVar5 + 2;
    } while ((uint)k != uVar10);
  }
  if (ANNScale != (double *)0x0) {
    operator_delete__(ANNScale);
  }
  if (ANNTopology != (int *)0x0) {
    operator_delete__(ANNTopology);
  }
  pAVar8 = ANNkdPointMK;
  if (ANNkdPointMK != (ANNmin_k *)0x0) {
    if (ANNkdPointMK->mk != (mk_node *)0x0) {
      operator_delete__(ANNkdPointMK->mk);
    }
    operator_delete(pAVar8);
    return;
  }
  return;
}

Assistant:

void ANNkd_tree::annkSearch(
    ANNpoint q,          // the query point
    int k,               // number of near neighbors to return
    ANNidxArray nn_idx,  // nearest neighbor indices (returned)
    ANNdistArray dd,     // the approximate nearest neighbor
    double eps)          // the error bound
{
    ANNkdDim = dim;  // copy arguments to static equivs
    ANNScale = new double[dim];
    ANNTopology = new int[dim];
    for (int i = 0; i < dim; i++) {
        ANNScale[i] = Scale[i];
        ANNTopology[i] = Topology[i];
    }
    ANNkdQ = q;
    ANNkdPts = pts;
    ANNptsVisited = 0;  // initialize count of points visited

    if (k > n_pts) {  // too many near neighbors?
        annError("Requesting more near neighbors than data points", ANNabort);
    }

    ANNkdMaxErr = ANN_POW(1.0 + eps);
    //    FLOP(2)				// increment floating op count

    ANNkdPointMK = new ANNmin_k(k);  // create set for closest k points
                                     // search starting at the root
    root->ann_search(
        annBoxDistance(q, bnd_box_lo, bnd_box_hi, dim, ANNScale, ANNTopology));

    for (int i = 0; i < k; i++) {  // extract the k-th closest points
        dd[i] = ANNkdPointMK->ith_smallest_key(i);
        nn_idx[i] = ANNkdPointMK->ith_smallest_info(i);
    }
    delete[] ANNScale;
    delete[] ANNTopology;
    delete ANNkdPointMK;  // deallocate closest point set
}